

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O2

void printarrayblock(LispPTR base)

{
  LispPTR *pLVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  ulong uVar4;
  long lVar5;
  
  pLVar1 = NativeAligned4FromLAddr(base);
  pLVar2 = NativeAligned4FromLAddr((base + (uint)(ushort)*pLVar1 * 2) - 2);
  pLVar3 = NativeAligned4FromLAddr(base - 2);
  printf("This array block: 0x%x.  Previous: 0x%x.  Next: 0x%x.\n",(ulong)base,
         (ulong)(base + (uint)(ushort)*pLVar3 * -2),(ulong)(base + (uint)(ushort)*pLVar1 * 2));
  printf("          Length: %d cells.\n\n",(ulong)(ushort)*pLVar1);
  for (lVar5 = -0x50; lVar5 < 0; lVar5 = lVar5 + 4) {
    printf("%16p %8x\n",(long)pLVar1 + lVar5,(ulong)*(uint *)((long)pLVar1 + lVar5));
  }
  printf("%16p %8x <- array header\n",pLVar1,(ulong)*pLVar1);
  for (uVar4 = 0; uVar4 < 0x4c; uVar4 = uVar4 + 4) {
    printf("%16p %8x\n",(long)pLVar1 + uVar4 + 4,(ulong)*(uint *)((long)pLVar1 + uVar4 + 4));
  }
  puts(". . .");
  for (lVar5 = -0x50; lVar5 < 0; lVar5 = lVar5 + 4) {
    printf("%16p %8x\n",(long)pLVar2 + lVar5,(ulong)*(uint *)((long)pLVar2 + lVar5));
  }
  printf("%16p %8x <- array trailer\n",pLVar2,(ulong)*pLVar2);
  for (uVar4 = 0; uVar4 < 0x4c; uVar4 = uVar4 + 4) {
    printf("%16p %8x\n",(long)pLVar2 + uVar4 + 4,(ulong)*(uint *)((long)pLVar2 + uVar4 + 4));
  }
  return;
}

Assistant:

void printarrayblock(LispPTR base) {
  struct arrayblock *bbase, *btrailer, *ptrailer;
  LispPTR *addr;

  LispPTR pbase, nbase;

  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  btrailer = (struct arrayblock *)NativeAligned4FromLAddr(Trailer(base, bbase));
  ptrailer = (struct arrayblock *)NativeAligned4FromLAddr(base - ARRAYBLOCKTRAILERWORDS);

  nbase = base + 2 * bbase->arlen;
  pbase = base - 2 * ptrailer->arlen;

  printf("This array block: 0x%x.  Previous: 0x%x.  Next: 0x%x.\n", base, pbase, nbase);
  printf("          Length: %d cells.\n\n", bbase->arlen);

  addr = ((LispPTR *)bbase) - 20;
  for (; addr < (LispPTR *)bbase; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf("%16p %8x <- array header\n", (void *)addr, *addr);
  addr++;
  for (; addr < (LispPTR *)bbase + 20; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf(". . .\n");

  addr = ((LispPTR *)btrailer) - 20;
  for (; addr < (LispPTR *)btrailer; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf("%16p %8x <- array trailer\n", (void *)addr, *addr);
  addr++;
  for (; addr < (LispPTR *)btrailer + 20; addr++) printf("%16p %8x\n", (void *)addr, *addr);
}